

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value chaiscript::Boxed_Number::const_unary_go<double>(Opers t_oper,double *t)

{
  bad_any_cast *this;
  undefined4 in_register_0000003c;
  Boxed_Value BVar1;
  
  if (((int)t != 0x23) && ((int)t != 0x24)) {
    this = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar1 = detail::const_var_impl<double>((double *)CONCAT44(in_register_0000003c,t_oper));
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)CONCAT44(in_register_0000003c,t_oper);
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_unary_go(Operators::Opers t_oper, const T &t)
      {
        switch (t_oper)
        {
          case Operators::unary_minus:
            return const_var(-t);
          case Operators::unary_plus:
            return const_var(+t);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }